

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::AsyncIoStreamWithGuards::tryRead
          (AsyncIoStreamWithGuards *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  anon_class_32_4_a4bd11c1_for_func aStack_58;
  
  if (*(char *)((long)buffer + 0x48) == '\x01') {
    (**(code **)(**(long **)((long)buffer + 0x20) + 8))
              (this,*(long **)((long)buffer + 0x20),minBytes,maxBytes);
  }
  else {
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)&aStack_58);
    aStack_58.buffer = buffer;
    aStack_58.minBytes = minBytes;
    aStack_58.maxBytes = maxBytes;
    Promise<void>::
    then<kj::AsyncIoStreamWithGuards::tryRead(void*,unsigned_long,unsigned_long)::_lambda()_1_>
              ((Promise<void> *)this,&aStack_58);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&aStack_58);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    if (readGuardReleased) {
      return inner->tryRead(buffer, minBytes, maxBytes);
    }
    return readGuard.addBranch().then([this, buffer, minBytes, maxBytes] {
      return inner->tryRead(buffer, minBytes, maxBytes);
    });
  }